

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# J2CLOpts.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_150::GlobalAssignmentCollector::visitGlobal
          (GlobalAssignmentCollector *this,Global *curr)

{
  bool bVar1;
  Global *curr_local;
  GlobalAssignmentCollector *this_local;
  
  bVar1 = isInitialValue(this,curr->init);
  if (!bVar1) {
    recordGlobalAssignment(this,(Name)(curr->super_Importable).super_Named.name.super_IString.str);
  }
  return;
}

Assistant:

void visitGlobal(Global* curr) {
    if (isInitialValue(curr->init)) {
      return;
    }
    // J2CL normally doesn't set non-default initial values, however, just in
    // case other passes in binaryen do something and set a value to the global
    // we should back off by recording this as an assignment.
    recordGlobalAssignment(curr->name);
  }